

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int send_list(socket_server *ss,socket *s,wb_list *list,socket_message *result)

{
  ushort uVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  socklen_t __addr_len;
  write_buffer *__ptr;
  sockaddr local_4c;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  __ptr = list->head;
  if (s->protocol == 0) {
    while (__ptr != (write_buffer *)0x0) {
      while( true ) {
        sVar3 = write(s->fd,__ptr->ptr,(long)__ptr->sz);
        uVar2 = (uint)sVar3;
        if (-1 < (int)uVar2) break;
        piVar4 = __errno_location();
        if (*piVar4 != 4) {
          if (*piVar4 == 0xb) {
            return -1;
          }
          force_close(ss,s,result);
          return 1;
        }
      }
      s->wb_size = s->wb_size - (ulong)(uVar2 & 0x7fffffff);
      iVar5 = __ptr->sz - uVar2;
      if (iVar5 != 0) {
        __ptr->ptr = __ptr->ptr + (uVar2 & 0x7fffffff);
        __ptr->sz = iVar5;
        return -1;
      }
      list->head = __ptr->next;
      if (__ptr->userobject == true) {
        (*(ss->soi).free)(__ptr->buffer);
      }
      else {
        free(__ptr->buffer);
      }
      free(__ptr);
      __ptr = list->head;
    }
  }
  else if (__ptr != (write_buffer *)0x0) {
    do {
      uVar1 = s->protocol;
      __addr_len = 0;
      if (uVar1 == __ptr->udp_address[0]) {
        if (uVar1 == 2) {
          local_4c.sa_data[2] = '\0';
          local_4c.sa_data[3] = '\0';
          local_4c.sa_data[4] = '\0';
          local_4c.sa_data[5] = '\0';
          uStack_34 = 0;
          local_4c.sa_family = 10;
          local_4c.sa_data._6_4_ = SUB84(*(undefined8 *)(__ptr->udp_address + 3),0);
          local_4c.sa_data._10_4_ = SUB84((ulong)*(undefined8 *)(__ptr->udp_address + 3) >> 0x20,0);
          uStack_3c = (undefined4)*(undefined8 *)(__ptr->udp_address + 0xb);
          local_38 = (undefined4)((ulong)*(undefined8 *)(__ptr->udp_address + 0xb) >> 0x20);
          __addr_len = 0x1c;
          local_4c.sa_data._0_2_ = *(undefined2 *)(__ptr->udp_address + 1);
        }
        else if (uVar1 == 1) {
          local_4c.sa_data[6] = '\0';
          local_4c.sa_data[7] = '\0';
          local_4c.sa_data[8] = '\0';
          local_4c.sa_data[9] = '\0';
          local_4c.sa_data[10] = '\0';
          local_4c.sa_data[0xb] = '\0';
          local_4c.sa_data[0xc] = '\0';
          local_4c.sa_data[0xd] = '\0';
          local_4c.sa_family = 2;
          local_4c.sa_data._2_4_ = *(undefined4 *)(__ptr->udp_address + 3);
          __addr_len = 0x10;
          local_4c.sa_data._0_2_ = *(undefined2 *)(__ptr->udp_address + 1);
        }
      }
      sVar3 = sendto(s->fd,__ptr->ptr,(long)__ptr->sz,0,&local_4c,__addr_len);
      if ((int)sVar3 < 0) {
        piVar4 = __errno_location();
        if (*piVar4 == 4) {
          return -1;
        }
        if (*piVar4 == 0xb) {
          return -1;
        }
        send_list_cold_1();
        return -1;
      }
      s->wb_size = s->wb_size - (long)__ptr->sz;
      list->head = __ptr->next;
      if (__ptr->userobject == true) {
        (*(ss->soi).free)(__ptr->buffer);
      }
      else {
        free(__ptr->buffer);
      }
      free(__ptr);
      __ptr = list->head;
    } while (__ptr != (write_buffer *)0x0);
  }
  list->tail = (write_buffer *)0x0;
  return -1;
}

Assistant:

static int
send_list(struct socket_server *ss, struct socket *s, struct wb_list *list, struct socket_message *result) {
	if (s->protocol == PROTOCOL_TCP) {
		return send_list_tcp(ss, s, list, result);
	} else {
		return send_list_udp(ss, s, list, result);
	}
}